

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  pointer puVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined3 in_register_00000089;
  uint8_t *imageX;
  uchar *puVar9;
  iterator data;
  pointer __s;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  bVar2 = image->_colorCount;
  uVar7 = width * bVar2;
  uVar3 = height;
  if (CONCAT31(in_register_00000089,horizontal) != 0) {
    uVar3 = uVar7;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(projection,(ulong)uVar3);
  __s = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar4 = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar4) {
    memset(__s,0,((long)puVar4 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  uVar3 = image->_rowSize;
  puVar9 = image->_data + (ulong)(bVar2 * x) + (ulong)(y * uVar3);
  if (horizontal) {
    if (uVar7 != 0) {
      puVar5 = puVar9 + uVar7;
      do {
        if ((ulong)(height * uVar3) != 0) {
          uVar7 = *__s;
          uVar8 = 0;
          do {
            pbVar1 = puVar9 + uVar8;
            uVar8 = uVar8 + uVar3;
            uVar7 = uVar7 + *pbVar1;
            *__s = uVar7;
          } while (height * uVar3 != uVar8);
        }
        puVar9 = puVar9 + 1;
        __s = __s + 1;
      } while (puVar9 != puVar5);
    }
  }
  else if (height * uVar3 != 0) {
    puVar5 = puVar9 + height * uVar3;
    do {
      if (uVar7 != 0) {
        uVar6 = *__s;
        uVar8 = 0;
        do {
          pbVar1 = puVar9 + uVar8;
          uVar8 = uVar8 + 1;
          uVar6 = uVar6 + *pbVar1;
          *__s = uVar6;
        } while (uVar7 != uVar8);
      }
      puVar9 = puVar9 + uVar3;
      __s = __s + 1;
    } while (puVar9 != puVar5);
  }
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();

        projection.resize( horizontal ? width * colorCount : height );
        std::fill( projection.begin(), projection.end(), 0u );

        const uint32_t rowSize = image.rowSize();

        width = width * colorCount;

        if( horizontal ) {
            const uint8_t * imageX = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageX != imageXEnd; ++imageX, ++data ) {
                const uint8_t * imageY    = imageX;
                const uint8_t * imageYEnd = imageY + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize )
                    (*data) += (*imageY);
            }
        }
        else {
            const uint8_t * imageY = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageYEnd = imageY + height * rowSize;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageY != imageYEnd; imageY += rowSize, ++data ) {
                const uint8_t * imageX    = imageY;
                const uint8_t * imageXEnd = imageX + width;

                for( ; imageX != imageXEnd; ++imageX )
                    (*data) += (*imageX);
            }
        }
    }